

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

void __thiscall
nuraft::asio_rpc_client::sent
          (asio_rpc_client *this,ptr<req_msg> *req,ptr<buffer> *buf,rpc_handler *when_done,
          error_code err,size_t bytes_transferred)

{
  bool is_ssl;
  int args;
  char *args_1;
  char *args_2;
  ptr<buffer> *ppVar1;
  byte *pbVar2;
  ptr<resp_msg> rsp;
  ptr<rpc_exception> except;
  ptr<asio_rpc_client> self;
  mutable_buffers_1 local_128 [2];
  undefined1 local_108 [8];
  ptr<buffer> resp_buf;
  _Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>
  local_90;
  
  std::__shared_ptr<nuraft::asio_rpc_client,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<nuraft::asio_rpc_client,void>
            ((__shared_ptr<nuraft::asio_rpc_client,(__gnu_cxx::_Lock_policy)2> *)&self,
             (__weak_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<nuraft::asio_rpc_client>);
  if (err._M_value == 0) {
    buffer::alloc((buffer *)&resp_buf,0x27);
    is_ssl = this->ssl_enabled_;
    pbVar2 = buffer::data(resp_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
    local_128[0].super_mutable_buffer.size_ =
         buffer::size(resp_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     );
    rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)response_read;
    rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_128[0].super_mutable_buffer.data_ = pbVar2;
    std::
    _Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::shared_ptr<nuraft::buffer>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::shared_ptr<nuraft::buffer>&,std::error_code,unsigned_long)>
    ::
    _Bind<std::shared_ptr<nuraft::asio_rpc_client>&,std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::shared_ptr<nuraft::buffer>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
              ((_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::shared_ptr<nuraft::buffer>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::shared_ptr<nuraft::buffer>&,std::error_code,unsigned_long)>
                *)&local_90,(offset_in_asio_rpc_client_to_subr *)&rsp,&self,req,when_done,&resp_buf,
               (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2);
    aa::
    read<asio::mutable_buffers_1,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::shared_ptr<nuraft::buffer>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::shared_ptr<nuraft::buffer>&,std::error_code,unsigned_long)>>
              (is_ssl,&this->ssl_socket_,&this->socket_,local_128,&local_90);
    std::
    _Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
    ::~_Tuple_impl(&local_90._M_bound_args.
                    super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                  );
    ppVar1 = &resp_buf;
  }
  else {
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::cancel(&this->operation_timer_);
    LOCK();
    (this->abandoned_)._M_base._M_i = true;
    UNLOCK();
    rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    args = (((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           super_msg_base).dst_;
    args_1 = (this->host_)._M_dataplus._M_p;
    args_2 = (this->port_)._M_dataplus._M_p;
    (**(code **)(*(long *)err._M_cat + 0x20))(local_128,err._M_cat,err._0_8_ & 0xffffffff);
    local_108 = (undefined1  [8])
                strfmt<100>::fmt<int,char_const*,char_const*,int,char_const*>
                          ((strfmt<100> *)&resp_buf,args,args_1,args_2,err._M_value,
                           (char *)local_128[0].super_mutable_buffer.data_);
    std::make_shared<nuraft::rpc_exception,char_const*,std::shared_ptr<nuraft::req_msg>&>
              ((char **)&except,(shared_ptr<nuraft::req_msg> *)local_108);
    std::__cxx11::string::~string((string *)local_128);
    std::
    function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
    operator()(when_done,&rsp,&except);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ppVar1 = (ptr<buffer> *)&rsp;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&((__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2> *)
              &ppVar1->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)->_M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&self.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void sent( ptr<req_msg>& req,
               ptr<buffer>& buf,
               rpc_handler& when_done,
               std::error_code err,
               size_t bytes_transferred )
    {
        // Now we can safely free the `req_buf`.
        (void)buf;
        ptr<asio_rpc_client> self(this->shared_from_this());
        if (!err) {
            // read a response
            ptr<buffer> resp_buf(buffer::alloc(RPC_RESP_HEADER_SIZE));
            aa::read( ssl_enabled_, ssl_socket_, socket_,
                      asio::buffer(resp_buf->data(), resp_buf->size()),
                      std::bind(&asio_rpc_client::response_read,
                                self,
                                req,
                                when_done,
                                resp_buf,
                                std::placeholders::_1,
                                std::placeholders::_2));

        } else {
            operation_timer_.cancel();
            abandoned_ = true;
            ptr<resp_msg> rsp;
            ptr<rpc_exception> except
                ( cs_new<rpc_exception>
                  ( sstrfmt( "failed to send request to peer %d, %s:%s, "
                             "error %d, %s" )
                           .fmt( req->get_dst(), host_.c_str(),
                                 port_.c_str(), err.value(), err.message().c_str() ),
                    req ) );
            close_socket();
            when_done(rsp, except);
        }
    }